

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O2

void apply_explicit_binding
               (_mesa_glsl_parse_state *state,YYLTYPE *loc,ir_variable *var,glsl_type *type,
               ast_type_qualifier *qual)

{
  undefined1 *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  glsl_type *this;
  char *pcVar5;
  uint qual_binding;
  uint local_3c;
  gl_context *local_38;
  
  if ((undefined1  [12])((undefined1  [12])qual->flags & (undefined1  [12])0xc00) ==
      (undefined1  [12])0x0) {
    _mesa_glsl_error(loc,state,
                     "the \"binding\" qualifier only applies to uniforms and shader storage buffer objects"
                    );
    return;
  }
  bVar2 = process_qualifier_constant(state,loc,"binding",qual->binding,&qual_binding);
  if (!bVar2) {
    return;
  }
  local_38 = state->ctx;
  if (type->field_0x4 == '\x11') {
    uVar3 = glsl_type::arrays_of_arrays_size(type);
  }
  else {
    uVar3 = 1;
  }
  local_3c = (qual_binding + uVar3) - 1;
  this = glsl_type::without_array(type);
  if (this->field_0x4 == '\f') {
    if (local_3c < (local_38->Const).MaxCombinedTextureImageUnits) goto LAB_00198aa5;
    pcVar5 = 
    "layout(binding = %d) for %d samplers exceeds the maximum number of texture image units (%u)";
  }
  else {
    if (this->field_0x4 != '\x10') {
      bVar2 = glsl_type::contains_atomic(this);
      if (bVar2) {
        uVar3 = (local_38->Const).MaxAtomicBufferBindings;
        if (0x5a < uVar3) {
          __assert_fail("ctx->Const.MaxAtomicBufferBindings <= MAX_COMBINED_ATOMIC_BUFFERS",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ast_to_hir.cpp"
                        ,0xb8e,
                        "void apply_explicit_binding(struct _mesa_glsl_parse_state *, YYLTYPE *, ir_variable *, const glsl_type *, const ast_type_qualifier *)"
                       );
        }
        if (uVar3 <= qual_binding) {
          pcVar5 = 
          "layout(binding = %d) exceeds the maximum number of atomic counter buffer bindings (%u)";
LAB_00198afa:
          _mesa_glsl_error(loc,state,pcVar5,(ulong)qual_binding);
          return;
        }
      }
      else {
        uVar3 = state->forced_language_version;
        if (uVar3 == 0) {
          uVar3 = state->language_version;
        }
        uVar4 = 0x1a3;
        if (state->es_shader != false) {
          uVar4 = 0x135;
        }
        if (((uVar3 <= uVar4) && (state->ARB_shading_language_420pack_enable != true)) ||
           (this->field_0x4 != '\r')) {
          _mesa_glsl_error(loc,state,
                           "the \"binding\" qualifier only applies to uniform blocks, storage blocks, opaque variables, or arrays thereof"
                          );
          return;
        }
        uVar3 = (local_38->Const).MaxImageUnits;
        if (0xc0 < uVar3) {
          __assert_fail("ctx->Const.MaxImageUnits <= MAX_IMAGE_UNITS",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ast_to_hir.cpp"
                        ,0xb9a,
                        "void apply_explicit_binding(struct _mesa_glsl_parse_state *, YYLTYPE *, ir_variable *, const glsl_type *, const ast_type_qualifier *)"
                       );
        }
        if (uVar3 <= local_3c) {
          pcVar5 = "Image binding %d exceeds the maximum number of image units (%d)";
          qual_binding = local_3c;
          goto LAB_00198afa;
        }
      }
LAB_00198aa5:
      puVar1 = &(var->data).field_0x2;
      *puVar1 = *puVar1 | 0x10;
      (var->data).binding = (uint16_t)qual_binding;
      return;
    }
    uVar4 = (uint)*(undefined8 *)&qual->flags;
    if (((uVar4 >> 10 & 1) == 0) || (local_3c < (local_38->Const).MaxUniformBufferBindings)) {
      if (((uVar4 >> 0xb & 1) == 0) || (local_3c < (local_38->Const).MaxShaderStorageBufferBindings)
         ) goto LAB_00198aa5;
      pcVar5 = 
      "layout(binding = %u) for %d SSBOs exceeds the maximum number of SSBO binding points (%d)";
    }
    else {
      pcVar5 = 
      "layout(binding = %u) for %d UBOs exceeds the maximum number of UBO binding points (%d)";
    }
  }
  _mesa_glsl_error(loc,state,pcVar5,(ulong)qual_binding,(ulong)uVar3);
  return;
}

Assistant:

static void
apply_explicit_binding(struct _mesa_glsl_parse_state *state,
                       YYLTYPE *loc,
                       ir_variable *var,
                       const glsl_type *type,
                       const ast_type_qualifier *qual)
{
   if (!qual->flags.q.uniform && !qual->flags.q.buffer) {
      _mesa_glsl_error(loc, state,
                       "the \"binding\" qualifier only applies to uniforms and "
                       "shader storage buffer objects");
      return;
   }

   unsigned qual_binding;
   if (!process_qualifier_constant(state, loc, "binding", qual->binding,
                                   &qual_binding)) {
      return;
   }

   const struct gl_context *const ctx = state->ctx;
   unsigned elements = type->is_array() ? type->arrays_of_arrays_size() : 1;
   unsigned max_index = qual_binding + elements - 1;
   const glsl_type *base_type = type->without_array();

   if (base_type->is_interface()) {
      /* UBOs.  From page 60 of the GLSL 4.20 specification:
       * "If the binding point for any uniform block instance is less than zero,
       *  or greater than or equal to the implementation-dependent maximum
       *  number of uniform buffer bindings, a compilation error will occur.
       *  When the binding identifier is used with a uniform block instanced as
       *  an array of size N, all elements of the array from binding through
       *  binding + N – 1 must be within this range."
       *
       * The implementation-dependent maximum is GL_MAX_UNIFORM_BUFFER_BINDINGS.
       */
      if (qual->flags.q.uniform &&
         max_index >= ctx->Const.MaxUniformBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %u) for %d UBOs exceeds "
                          "the maximum number of UBO binding points (%d)",
                          qual_binding, elements,
                          ctx->Const.MaxUniformBufferBindings);
         return;
      }

      /* SSBOs. From page 67 of the GLSL 4.30 specification:
       * "If the binding point for any uniform or shader storage block instance
       *  is less than zero, or greater than or equal to the
       *  implementation-dependent maximum number of uniform buffer bindings, a
       *  compile-time error will occur. When the binding identifier is used
       *  with a uniform or shader storage block instanced as an array of size
       *  N, all elements of the array from binding through binding + N – 1 must
       *  be within this range."
       */
      if (qual->flags.q.buffer &&
         max_index >= ctx->Const.MaxShaderStorageBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %u) for %d SSBOs exceeds "
                          "the maximum number of SSBO binding points (%d)",
                          qual_binding, elements,
                          ctx->Const.MaxShaderStorageBufferBindings);
         return;
      }
   } else if (base_type->is_sampler()) {
      /* Samplers.  From page 63 of the GLSL 4.20 specification:
       * "If the binding is less than zero, or greater than or equal to the
       *  implementation-dependent maximum supported number of units, a
       *  compilation error will occur. When the binding identifier is used
       *  with an array of size N, all elements of the array from binding
       *  through binding + N - 1 must be within this range."
       */
      unsigned limit = ctx->Const.MaxCombinedTextureImageUnits;

      if (max_index >= limit) {
         _mesa_glsl_error(loc, state, "layout(binding = %d) for %d samplers "
                          "exceeds the maximum number of texture image units "
                          "(%u)", qual_binding, elements, limit);

         return;
      }
   } else if (base_type->contains_atomic()) {
      assert(ctx->Const.MaxAtomicBufferBindings <= MAX_COMBINED_ATOMIC_BUFFERS);
      if (qual_binding >= ctx->Const.MaxAtomicBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %d) exceeds the "
                          "maximum number of atomic counter buffer bindings "
                          "(%u)", qual_binding,
                          ctx->Const.MaxAtomicBufferBindings);

         return;
      }
   } else if ((state->is_version(420, 310) ||
               state->ARB_shading_language_420pack_enable) &&
              base_type->is_image()) {
      assert(ctx->Const.MaxImageUnits <= MAX_IMAGE_UNITS);
      if (max_index >= ctx->Const.MaxImageUnits) {
         _mesa_glsl_error(loc, state, "Image binding %d exceeds the "
                          "maximum number of image units (%d)", max_index,
                          ctx->Const.MaxImageUnits);
         return;
      }

   } else {
      _mesa_glsl_error(loc, state,
                       "the \"binding\" qualifier only applies to uniform "
                       "blocks, storage blocks, opaque variables, or arrays "
                       "thereof");
      return;
   }

   var->data.explicit_binding = true;
   var->data.binding = qual_binding;

   return;
}